

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

string * httplib::detail::make_multipart_data_boundary_abi_cxx11_(void)

{
  initializer_list<unsigned_int> __il;
  result_type rVar1;
  result_type rVar2;
  result_type_conflict rVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  int i;
  mt19937 engine;
  seed_seq seed_sequence;
  random_device seed_gen;
  string *result;
  seed_seq *in_stack_ffffffffffffd838;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *in_stack_ffffffffffffd840;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  *this;
  undefined4 in_stack_ffffffffffffd870;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  undefined1 *puVar4;
  undefined4 in_stack_ffffffffffffd890;
  int local_2768;
  mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
  local_2762;
  result_type local_13c8;
  result_type local_13c4;
  result_type local_13c0;
  result_type local_13bc;
  result_type *local_13b8;
  undefined8 local_13b0;
  undefined1 local_1390 [5008];
  
  puVar4 = local_1390;
  this_00 = in_RDI;
  std::random_device::random_device((random_device *)in_RDI);
  rVar1 = std::random_device::operator()((random_device *)0x1cecf8);
  local_13c8 = rVar1;
  rVar2 = std::random_device::operator()((random_device *)0x1ced23);
  local_13c4 = rVar2;
  local_13c0 = std::random_device::operator()((random_device *)0x1ced4e);
  local_13bc = std::random_device::operator()((random_device *)0x1ced79);
  local_13b8 = &local_13c8;
  local_13b0 = 4;
  __il._M_len._0_4_ = in_stack_ffffffffffffd890;
  __il._M_array = (iterator)puVar4;
  __il._M_len._4_4_ = rVar1;
  std::seed_seq::seed_seq<unsigned_int,void>((seed_seq *)this_00,__il);
  std::
  mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>
  ::mersenne_twister_engine<std::seed_seq,void>(in_stack_ffffffffffffd840,in_stack_ffffffffffffd838)
  ;
  local_2762._M_x[0]._1_1_ = 0;
  this = &local_2762;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (this_00,(char *)in_RDI,(allocator<char> *)CONCAT44(rVar2,in_stack_ffffffffffffd870));
  std::allocator<char>::~allocator((allocator<char> *)&local_2762);
  for (local_2768 = 0; local_2768 < 0x10; local_2768 = local_2768 + 1) {
    rVar3 = std::
            mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
            ::operator()(this);
    std::__cxx11::string::operator+=
              ((string *)in_RDI,
               "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz"[rVar3 % 0x3e]);
  }
  local_2762._M_x[0]._1_1_ = 1;
  std::seed_seq::~seed_seq((seed_seq *)0x1cef18);
  std::random_device::~random_device((random_device *)0x1cef25);
  return this_00;
}

Assistant:

inline std::string make_multipart_data_boundary() {
            static const char data[] =
                "0123456789ABCDEFGHIJKLMNOPQRSTUVWXYZabcdefghijklmnopqrstuvwxyz";

            // std::random_device might actually be deterministic on some
            // platforms, but due to lack of support in the c++ standard library,
            // doing better requires either some ugly hacks or breaking portability.
            std::random_device seed_gen;

            // Request 128 bits of entropy for initialization
            std::seed_seq seed_sequence{ seed_gen(), seed_gen(), seed_gen(), seed_gen() };
            std::mt19937 engine(seed_sequence);

            std::string result = "--cpp-httplib-multipart-data-";

            for (auto i = 0; i < 16; i++) {
                result += data[engine() % (sizeof(data) - 1)];
            }

            return result;
        }